

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void init_intra_predictors_internal(void)

{
  pred[1][0] = aom_v_predictor_4x4_sse2;
  pred[1][1] = aom_v_predictor_8x8_sse2;
  pred[1][2] = aom_v_predictor_16x16_sse2;
  pred[1][3] = aom_v_predictor_32x32;
  pred[1][4] = aom_v_predictor_64x64;
  pred[1][5] = aom_v_predictor_4x8_sse2;
  pred[1][6] = aom_v_predictor_8x4_sse2;
  pred[1][7] = aom_v_predictor_8x16_sse2;
  pred[1][8] = aom_v_predictor_16x8_sse2;
  pred[1][9] = aom_v_predictor_16x32_sse2;
  pred[1][10] = aom_v_predictor_32x16;
  pred[1][0xb] = aom_v_predictor_32x64;
  pred[1][0xc] = aom_v_predictor_64x32;
  pred[1][0xd] = aom_v_predictor_4x16_sse2;
  pred[1][0xe] = aom_v_predictor_16x4_sse2;
  pred[1][0xf] = aom_v_predictor_8x32_sse2;
  pred[1][0x10] = aom_v_predictor_32x8_sse2;
  pred[1][0x11] = aom_v_predictor_16x64_sse2;
  pred[1][0x12] = aom_v_predictor_64x16;
  pred[2][0] = aom_h_predictor_4x4_sse2;
  pred[2][1] = aom_h_predictor_8x8_sse2;
  pred[2][2] = aom_h_predictor_16x16_sse2;
  pred[2][3] = aom_h_predictor_32x32;
  pred[2][4] = aom_h_predictor_64x64_sse2;
  pred[2][5] = aom_h_predictor_4x8_sse2;
  pred[2][6] = aom_h_predictor_8x4_sse2;
  pred[2][7] = aom_h_predictor_8x16_sse2;
  pred[2][8] = aom_h_predictor_16x8_sse2;
  pred[2][9] = aom_h_predictor_16x32_sse2;
  pred[2][10] = aom_h_predictor_32x16_sse2;
  pred[2][0xb] = aom_h_predictor_32x64_sse2;
  pred[2][0xc] = aom_h_predictor_64x32_sse2;
  pred[2][0xd] = aom_h_predictor_4x16_sse2;
  pred[2][0xe] = aom_h_predictor_16x4_sse2;
  pred[2][0xf] = aom_h_predictor_8x32_sse2;
  pred[2][0x10] = aom_h_predictor_32x8_sse2;
  pred[2][0x11] = aom_h_predictor_16x64_sse2;
  pred[2][0x12] = aom_h_predictor_64x16_sse2;
  pred[0xc][0] = aom_paeth_predictor_4x4;
  pred[0xc][1] = aom_paeth_predictor_8x8;
  pred[0xc][2] = aom_paeth_predictor_16x16;
  pred[0xc][3] = aom_paeth_predictor_32x32;
  pred[0xc][4] = aom_paeth_predictor_64x64;
  pred[0xc][5] = aom_paeth_predictor_4x8;
  pred[0xc][6] = aom_paeth_predictor_8x4;
  pred[0xc][7] = aom_paeth_predictor_8x16;
  pred[0xc][8] = aom_paeth_predictor_16x8;
  pred[0xc][9] = aom_paeth_predictor_16x32;
  pred[0xc][10] = aom_paeth_predictor_32x16;
  pred[0xc][0xb] = aom_paeth_predictor_32x64;
  pred[0xc][0xc] = aom_paeth_predictor_64x32;
  pred[0xc][0xd] = aom_paeth_predictor_4x16;
  pred[0xc][0xe] = aom_paeth_predictor_16x4;
  pred[0xc][0xf] = aom_paeth_predictor_8x32;
  pred[0xc][0x10] = aom_paeth_predictor_32x8;
  pred[0xc][0x11] = aom_paeth_predictor_16x64;
  pred[0xc][0x12] = aom_paeth_predictor_64x16;
  pred[9][0] = aom_smooth_predictor_4x4;
  pred[9][1] = aom_smooth_predictor_8x8;
  pred[9][2] = aom_smooth_predictor_16x16;
  pred[9][3] = aom_smooth_predictor_32x32;
  pred[9][4] = aom_smooth_predictor_64x64;
  pred[9][5] = aom_smooth_predictor_4x8;
  pred[9][6] = aom_smooth_predictor_8x4;
  pred[9][7] = aom_smooth_predictor_8x16;
  pred[9][8] = aom_smooth_predictor_16x8;
  pred[9][9] = aom_smooth_predictor_16x32;
  pred[9][10] = aom_smooth_predictor_32x16;
  pred[9][0xb] = aom_smooth_predictor_32x64;
  pred[9][0xc] = aom_smooth_predictor_64x32;
  pred[9][0xd] = aom_smooth_predictor_4x16;
  pred[9][0xe] = aom_smooth_predictor_16x4;
  pred[9][0xf] = aom_smooth_predictor_8x32;
  pred[9][0x10] = aom_smooth_predictor_32x8;
  pred[9][0x11] = aom_smooth_predictor_16x64;
  pred[9][0x12] = aom_smooth_predictor_64x16;
  pred[10][0] = aom_smooth_v_predictor_4x4;
  pred[10][1] = aom_smooth_v_predictor_8x8;
  pred[10][2] = aom_smooth_v_predictor_16x16;
  pred[10][3] = aom_smooth_v_predictor_32x32;
  pred[10][4] = aom_smooth_v_predictor_64x64;
  pred[10][5] = aom_smooth_v_predictor_4x8;
  pred[10][6] = aom_smooth_v_predictor_8x4;
  pred[10][7] = aom_smooth_v_predictor_8x16;
  pred[10][8] = aom_smooth_v_predictor_16x8;
  pred[10][9] = aom_smooth_v_predictor_16x32;
  pred[10][10] = aom_smooth_v_predictor_32x16;
  pred[10][0xb] = aom_smooth_v_predictor_32x64;
  pred[10][0xc] = aom_smooth_v_predictor_64x32;
  pred[10][0xd] = aom_smooth_v_predictor_4x16;
  pred[10][0xe] = aom_smooth_v_predictor_16x4;
  pred[10][0xf] = aom_smooth_v_predictor_8x32;
  pred[10][0x10] = aom_smooth_v_predictor_32x8;
  pred[10][0x11] = aom_smooth_v_predictor_16x64;
  pred[10][0x12] = aom_smooth_v_predictor_64x16;
  pred[0xb][0] = aom_smooth_h_predictor_4x4;
  pred[0xb][1] = aom_smooth_h_predictor_8x8;
  pred[0xb][2] = aom_smooth_h_predictor_16x16;
  pred[0xb][3] = aom_smooth_h_predictor_32x32;
  pred[0xb][4] = aom_smooth_h_predictor_64x64;
  pred[0xb][5] = aom_smooth_h_predictor_4x8;
  pred[0xb][6] = aom_smooth_h_predictor_8x4;
  pred[0xb][7] = aom_smooth_h_predictor_8x16;
  pred[0xb][8] = aom_smooth_h_predictor_16x8;
  pred[0xb][9] = aom_smooth_h_predictor_16x32;
  pred[0xb][10] = aom_smooth_h_predictor_32x16;
  pred[0xb][0xb] = aom_smooth_h_predictor_32x64;
  pred[0xb][0xc] = aom_smooth_h_predictor_64x32;
  pred[0xb][0xd] = aom_smooth_h_predictor_4x16;
  pred[0xb][0xe] = aom_smooth_h_predictor_16x4;
  pred[0xb][0xf] = aom_smooth_h_predictor_8x32;
  pred[0xb][0x10] = aom_smooth_h_predictor_32x8;
  pred[0xb][0x11] = aom_smooth_h_predictor_16x64;
  pred[0xb][0x12] = aom_smooth_h_predictor_64x16;
  dc_pred[0][0][0] = aom_dc_128_predictor_4x4_sse2;
  dc_pred[0][0][1] = aom_dc_128_predictor_8x8_sse2;
  dc_pred[0][0][2] = aom_dc_128_predictor_16x16_sse2;
  dc_pred[0][0][3] = aom_dc_128_predictor_32x32;
  dc_pred[0][0][4] = aom_dc_128_predictor_64x64;
  dc_pred[0][0][5] = aom_dc_128_predictor_4x8_sse2;
  dc_pred[0][0][6] = aom_dc_128_predictor_8x4_sse2;
  dc_pred[0][0][7] = aom_dc_128_predictor_8x16_sse2;
  dc_pred[0][0][8] = aom_dc_128_predictor_16x8_sse2;
  dc_pred[0][0][9] = aom_dc_128_predictor_16x32_sse2;
  dc_pred[0][0][10] = aom_dc_128_predictor_32x16;
  dc_pred[0][0][0xb] = aom_dc_128_predictor_32x64;
  dc_pred[0][0][0xc] = aom_dc_128_predictor_64x32;
  dc_pred[0][0][0xd] = aom_dc_128_predictor_4x16_sse2;
  dc_pred[0][0][0xe] = aom_dc_128_predictor_16x4_sse2;
  dc_pred[0][0][0xf] = aom_dc_128_predictor_8x32_sse2;
  dc_pred[0][0][0x10] = aom_dc_128_predictor_32x8_sse2;
  dc_pred[0][0][0x11] = aom_dc_128_predictor_16x64_sse2;
  dc_pred[0][0][0x12] = aom_dc_128_predictor_64x16;
  dc_pred[0][1][0] = aom_dc_top_predictor_4x4_sse2;
  dc_pred[0][1][1] = aom_dc_top_predictor_8x8_sse2;
  dc_pred[0][1][2] = aom_dc_top_predictor_16x16_sse2;
  dc_pred[0][1][3] = aom_dc_top_predictor_32x32;
  dc_pred[0][1][4] = aom_dc_top_predictor_64x64;
  dc_pred[0][1][5] = aom_dc_top_predictor_4x8_sse2;
  dc_pred[0][1][6] = aom_dc_top_predictor_8x4_sse2;
  dc_pred[0][1][7] = aom_dc_top_predictor_8x16_sse2;
  dc_pred[0][1][8] = aom_dc_top_predictor_16x8_sse2;
  dc_pred[0][1][9] = aom_dc_top_predictor_16x32_sse2;
  dc_pred[0][1][10] = aom_dc_top_predictor_32x16;
  dc_pred[0][1][0xb] = aom_dc_top_predictor_32x64;
  dc_pred[0][1][0xc] = aom_dc_top_predictor_64x32;
  dc_pred[0][1][0xd] = aom_dc_top_predictor_4x16_sse2;
  dc_pred[0][1][0xe] = aom_dc_top_predictor_16x4_sse2;
  dc_pred[0][1][0xf] = aom_dc_top_predictor_8x32_sse2;
  dc_pred[0][1][0x10] = aom_dc_top_predictor_32x8_sse2;
  dc_pred[0][1][0x11] = aom_dc_top_predictor_16x64_sse2;
  dc_pred[0][1][0x12] = aom_dc_top_predictor_64x16;
  dc_pred[1][0][0] = aom_dc_left_predictor_4x4_sse2;
  dc_pred[1][0][1] = aom_dc_left_predictor_8x8_sse2;
  dc_pred[1][0][2] = aom_dc_left_predictor_16x16_sse2;
  dc_pred[1][0][3] = aom_dc_left_predictor_32x32;
  dc_pred[1][0][4] = aom_dc_left_predictor_64x64;
  dc_pred[1][0][5] = aom_dc_left_predictor_4x8_sse2;
  dc_pred[1][0][6] = aom_dc_left_predictor_8x4_sse2;
  dc_pred[1][0][7] = aom_dc_left_predictor_8x16_sse2;
  dc_pred[1][0][8] = aom_dc_left_predictor_16x8_sse2;
  dc_pred[1][0][9] = aom_dc_left_predictor_16x32_sse2;
  dc_pred[1][0][10] = aom_dc_left_predictor_32x16;
  dc_pred[1][0][0xb] = aom_dc_left_predictor_32x64;
  dc_pred[1][0][0xc] = aom_dc_left_predictor_64x32;
  dc_pred[1][0][0xd] = aom_dc_left_predictor_4x16_sse2;
  dc_pred[1][0][0xe] = aom_dc_left_predictor_16x4_sse2;
  dc_pred[1][0][0xf] = aom_dc_left_predictor_8x32_sse2;
  dc_pred[1][0][0x10] = aom_dc_left_predictor_32x8_sse2;
  dc_pred[1][0][0x11] = aom_dc_left_predictor_16x64_sse2;
  dc_pred[1][0][0x12] = aom_dc_left_predictor_64x16;
  dc_pred[1][1][0] = aom_dc_predictor_4x4_sse2;
  dc_pred[1][1][1] = aom_dc_predictor_8x8_sse2;
  dc_pred[1][1][2] = aom_dc_predictor_16x16_sse2;
  dc_pred[1][1][3] = aom_dc_predictor_32x32;
  dc_pred[1][1][4] = aom_dc_predictor_64x64;
  dc_pred[1][1][5] = aom_dc_predictor_4x8_sse2;
  dc_pred[1][1][6] = aom_dc_predictor_8x4_sse2;
  dc_pred[1][1][7] = aom_dc_predictor_8x16_sse2;
  dc_pred[1][1][8] = aom_dc_predictor_16x8_sse2;
  dc_pred[1][1][9] = aom_dc_predictor_16x32_sse2;
  dc_pred[1][1][10] = aom_dc_predictor_32x16;
  dc_pred[1][1][0xb] = aom_dc_predictor_32x64;
  dc_pred[1][1][0xc] = aom_dc_predictor_64x32;
  dc_pred[1][1][0xd] = aom_dc_predictor_4x16_sse2;
  dc_pred[1][1][0xe] = aom_dc_predictor_16x4_sse2;
  dc_pred[1][1][0xf] = aom_dc_predictor_8x32_sse2;
  dc_pred[1][1][0x10] = aom_dc_predictor_32x8_sse2;
  dc_pred[1][1][0x11] = aom_dc_predictor_16x64_sse2;
  dc_pred[1][1][0x12] = aom_dc_predictor_64x16;
  pred_high[1][0] = aom_highbd_v_predictor_4x4_sse2;
  pred_high[1][1] = aom_highbd_v_predictor_8x8_sse2;
  pred_high[1][2] = aom_highbd_v_predictor_16x16_sse2;
  pred_high[1][3] = aom_highbd_v_predictor_32x32_sse2;
  pred_high[1][4] = aom_highbd_v_predictor_64x64_c;
  pred_high[1][5] = aom_highbd_v_predictor_4x8_sse2;
  pred_high[1][6] = aom_highbd_v_predictor_8x4_sse2;
  pred_high[1][7] = aom_highbd_v_predictor_8x16_sse2;
  pred_high[1][8] = aom_highbd_v_predictor_16x8_sse2;
  pred_high[1][9] = aom_highbd_v_predictor_16x32_sse2;
  pred_high[1][10] = aom_highbd_v_predictor_32x16_sse2;
  pred_high[1][0xb] = aom_highbd_v_predictor_32x64_c;
  pred_high[1][0xc] = aom_highbd_v_predictor_64x32_c;
  pred_high[1][0xd] = aom_highbd_v_predictor_4x16_c;
  pred_high[1][0xe] = aom_highbd_v_predictor_16x4_c;
  pred_high[1][0xf] = aom_highbd_v_predictor_8x32_c;
  pred_high[1][0x10] = aom_highbd_v_predictor_32x8_c;
  pred_high[1][0x11] = aom_highbd_v_predictor_16x64_c;
  pred_high[1][0x12] = aom_highbd_v_predictor_64x16_c;
  pred_high[2][0] = aom_highbd_h_predictor_4x4_sse2;
  pred_high[2][1] = aom_highbd_h_predictor_8x8_sse2;
  pred_high[2][2] = aom_highbd_h_predictor_16x16_sse2;
  pred_high[2][3] = aom_highbd_h_predictor_32x32_sse2;
  pred_high[2][4] = aom_highbd_h_predictor_64x64_c;
  pred_high[2][5] = aom_highbd_h_predictor_4x8_sse2;
  pred_high[2][6] = aom_highbd_h_predictor_8x4_sse2;
  pred_high[2][7] = aom_highbd_h_predictor_8x16_sse2;
  pred_high[2][8] = aom_highbd_h_predictor_16x8_sse2;
  pred_high[2][9] = aom_highbd_h_predictor_16x32_sse2;
  pred_high[2][10] = aom_highbd_h_predictor_32x16_sse2;
  pred_high[2][0xb] = aom_highbd_h_predictor_32x64_c;
  pred_high[2][0xc] = aom_highbd_h_predictor_64x32_c;
  pred_high[2][0xd] = aom_highbd_h_predictor_4x16_c;
  pred_high[2][0xe] = aom_highbd_h_predictor_16x4_c;
  pred_high[2][0xf] = aom_highbd_h_predictor_8x32_c;
  pred_high[2][0x10] = aom_highbd_h_predictor_32x8_c;
  pred_high[2][0x11] = aom_highbd_h_predictor_16x64_c;
  pred_high[2][0x12] = aom_highbd_h_predictor_64x16_c;
  pred_high[0xc][0] = aom_highbd_paeth_predictor_4x4_c;
  pred_high[0xc][1] = aom_highbd_paeth_predictor_8x8_c;
  pred_high[0xc][2] = aom_highbd_paeth_predictor_16x16_c;
  pred_high[0xc][3] = aom_highbd_paeth_predictor_32x32_c;
  pred_high[0xc][4] = aom_highbd_paeth_predictor_64x64_c;
  pred_high[0xc][5] = aom_highbd_paeth_predictor_4x8_c;
  pred_high[0xc][6] = aom_highbd_paeth_predictor_8x4_c;
  pred_high[0xc][7] = aom_highbd_paeth_predictor_8x16_c;
  pred_high[0xc][8] = aom_highbd_paeth_predictor_16x8_c;
  pred_high[0xc][9] = aom_highbd_paeth_predictor_16x32_c;
  pred_high[0xc][10] = aom_highbd_paeth_predictor_32x16_c;
  pred_high[0xc][0xb] = aom_highbd_paeth_predictor_32x64_c;
  pred_high[0xc][0xc] = aom_highbd_paeth_predictor_64x32_c;
  pred_high[0xc][0xd] = aom_highbd_paeth_predictor_4x16_c;
  pred_high[0xc][0xe] = aom_highbd_paeth_predictor_16x4_c;
  pred_high[0xc][0xf] = aom_highbd_paeth_predictor_8x32_c;
  pred_high[0xc][0x10] = aom_highbd_paeth_predictor_32x8_c;
  pred_high[0xc][0x11] = aom_highbd_paeth_predictor_16x64_c;
  pred_high[0xc][0x12] = aom_highbd_paeth_predictor_64x16_c;
  pred_high[9][0] = aom_highbd_smooth_predictor_4x4_c;
  pred_high[9][1] = aom_highbd_smooth_predictor_8x8_c;
  pred_high[9][2] = aom_highbd_smooth_predictor_16x16_c;
  pred_high[9][3] = aom_highbd_smooth_predictor_32x32_c;
  pred_high[9][4] = aom_highbd_smooth_predictor_64x64_c;
  pred_high[9][5] = aom_highbd_smooth_predictor_4x8_c;
  pred_high[9][6] = aom_highbd_smooth_predictor_8x4_c;
  pred_high[9][7] = aom_highbd_smooth_predictor_8x16_c;
  pred_high[9][8] = aom_highbd_smooth_predictor_16x8_c;
  pred_high[9][9] = aom_highbd_smooth_predictor_16x32_c;
  pred_high[9][10] = aom_highbd_smooth_predictor_32x16_c;
  pred_high[9][0xb] = aom_highbd_smooth_predictor_32x64_c;
  pred_high[9][0xc] = aom_highbd_smooth_predictor_64x32_c;
  pred_high[9][0xd] = aom_highbd_smooth_predictor_4x16_c;
  pred_high[9][0xe] = aom_highbd_smooth_predictor_16x4_c;
  pred_high[9][0xf] = aom_highbd_smooth_predictor_8x32_c;
  pred_high[9][0x10] = aom_highbd_smooth_predictor_32x8_c;
  pred_high[9][0x11] = aom_highbd_smooth_predictor_16x64_c;
  pred_high[9][0x12] = aom_highbd_smooth_predictor_64x16_c;
  pred_high[10][0] = aom_highbd_smooth_v_predictor_4x4_c;
  pred_high[10][1] = aom_highbd_smooth_v_predictor_8x8_c;
  pred_high[10][2] = aom_highbd_smooth_v_predictor_16x16_c;
  pred_high[10][3] = aom_highbd_smooth_v_predictor_32x32_c;
  pred_high[10][4] = aom_highbd_smooth_v_predictor_64x64_c;
  pred_high[10][5] = aom_highbd_smooth_v_predictor_4x8_c;
  pred_high[10][6] = aom_highbd_smooth_v_predictor_8x4_c;
  pred_high[10][7] = aom_highbd_smooth_v_predictor_8x16_c;
  pred_high[10][8] = aom_highbd_smooth_v_predictor_16x8_c;
  pred_high[10][9] = aom_highbd_smooth_v_predictor_16x32_c;
  pred_high[10][10] = aom_highbd_smooth_v_predictor_32x16_c;
  pred_high[10][0xb] = aom_highbd_smooth_v_predictor_32x64_c;
  pred_high[10][0xc] = aom_highbd_smooth_v_predictor_64x32_c;
  pred_high[10][0xd] = aom_highbd_smooth_v_predictor_4x16_c;
  pred_high[10][0xe] = aom_highbd_smooth_v_predictor_16x4_c;
  pred_high[10][0xf] = aom_highbd_smooth_v_predictor_8x32_c;
  pred_high[10][0x10] = aom_highbd_smooth_v_predictor_32x8_c;
  pred_high[10][0x11] = aom_highbd_smooth_v_predictor_16x64_c;
  pred_high[10][0x12] = aom_highbd_smooth_v_predictor_64x16_c;
  pred_high[0xb][0] = aom_highbd_smooth_h_predictor_4x4_c;
  pred_high[0xb][1] = aom_highbd_smooth_h_predictor_8x8_c;
  pred_high[0xb][2] = aom_highbd_smooth_h_predictor_16x16_c;
  pred_high[0xb][3] = aom_highbd_smooth_h_predictor_32x32_c;
  pred_high[0xb][4] = aom_highbd_smooth_h_predictor_64x64_c;
  pred_high[0xb][5] = aom_highbd_smooth_h_predictor_4x8_c;
  pred_high[0xb][6] = aom_highbd_smooth_h_predictor_8x4_c;
  pred_high[0xb][7] = aom_highbd_smooth_h_predictor_8x16_c;
  pred_high[0xb][8] = aom_highbd_smooth_h_predictor_16x8_c;
  pred_high[0xb][9] = aom_highbd_smooth_h_predictor_16x32_c;
  pred_high[0xb][10] = aom_highbd_smooth_h_predictor_32x16_c;
  pred_high[0xb][0xb] = aom_highbd_smooth_h_predictor_32x64_c;
  pred_high[0xb][0xc] = aom_highbd_smooth_h_predictor_64x32_c;
  pred_high[0xb][0xd] = aom_highbd_smooth_h_predictor_4x16_c;
  pred_high[0xb][0xe] = aom_highbd_smooth_h_predictor_16x4_c;
  pred_high[0xb][0xf] = aom_highbd_smooth_h_predictor_8x32_c;
  pred_high[0xb][0x10] = aom_highbd_smooth_h_predictor_32x8_c;
  pred_high[0xb][0x11] = aom_highbd_smooth_h_predictor_16x64_c;
  pred_high[0xb][0x12] = aom_highbd_smooth_h_predictor_64x16_c;
  dc_pred_high[0][0][0] = aom_highbd_dc_128_predictor_4x4_sse2;
  dc_pred_high[0][0][1] = aom_highbd_dc_128_predictor_8x8_sse2;
  dc_pred_high[0][0][2] = aom_highbd_dc_128_predictor_16x16_sse2;
  dc_pred_high[0][0][3] = aom_highbd_dc_128_predictor_32x32_sse2;
  dc_pred_high[0][0][4] = aom_highbd_dc_128_predictor_64x64_c;
  dc_pred_high[0][0][5] = aom_highbd_dc_128_predictor_4x8_sse2;
  dc_pred_high[0][0][6] = aom_highbd_dc_128_predictor_8x4_sse2;
  dc_pred_high[0][0][7] = aom_highbd_dc_128_predictor_8x16_sse2;
  dc_pred_high[0][0][8] = aom_highbd_dc_128_predictor_16x8_sse2;
  dc_pred_high[0][0][9] = aom_highbd_dc_128_predictor_16x32_sse2;
  dc_pred_high[0][0][10] = aom_highbd_dc_128_predictor_32x16_sse2;
  dc_pred_high[0][0][0xb] = aom_highbd_dc_128_predictor_32x64_c;
  dc_pred_high[0][0][0xc] = aom_highbd_dc_128_predictor_64x32_c;
  dc_pred_high[0][0][0xd] = aom_highbd_dc_128_predictor_4x16_c;
  dc_pred_high[0][0][0xe] = aom_highbd_dc_128_predictor_16x4_c;
  dc_pred_high[0][0][0xf] = aom_highbd_dc_128_predictor_8x32_c;
  dc_pred_high[0][0][0x10] = aom_highbd_dc_128_predictor_32x8_c;
  dc_pred_high[0][0][0x11] = aom_highbd_dc_128_predictor_16x64_c;
  dc_pred_high[0][0][0x12] = aom_highbd_dc_128_predictor_64x16_c;
  dc_pred_high[0][1][0] = aom_highbd_dc_top_predictor_4x4_sse2;
  dc_pred_high[0][1][1] = aom_highbd_dc_top_predictor_8x8_sse2;
  dc_pred_high[0][1][2] = aom_highbd_dc_top_predictor_16x16_sse2;
  dc_pred_high[0][1][3] = aom_highbd_dc_top_predictor_32x32_sse2;
  dc_pred_high[0][1][4] = aom_highbd_dc_top_predictor_64x64_c;
  dc_pred_high[0][1][5] = aom_highbd_dc_top_predictor_4x8_sse2;
  dc_pred_high[0][1][6] = aom_highbd_dc_top_predictor_8x4_sse2;
  dc_pred_high[0][1][7] = aom_highbd_dc_top_predictor_8x16_sse2;
  dc_pred_high[0][1][8] = aom_highbd_dc_top_predictor_16x8_sse2;
  dc_pred_high[0][1][9] = aom_highbd_dc_top_predictor_16x32_sse2;
  dc_pred_high[0][1][10] = aom_highbd_dc_top_predictor_32x16_sse2;
  dc_pred_high[0][1][0xb] = aom_highbd_dc_top_predictor_32x64_c;
  dc_pred_high[0][1][0xc] = aom_highbd_dc_top_predictor_64x32_c;
  dc_pred_high[0][1][0xd] = aom_highbd_dc_top_predictor_4x16_c;
  dc_pred_high[0][1][0xe] = aom_highbd_dc_top_predictor_16x4_c;
  dc_pred_high[0][1][0xf] = aom_highbd_dc_top_predictor_8x32_c;
  dc_pred_high[0][1][0x10] = aom_highbd_dc_top_predictor_32x8_c;
  dc_pred_high[0][1][0x11] = aom_highbd_dc_top_predictor_16x64_c;
  dc_pred_high[0][1][0x12] = aom_highbd_dc_top_predictor_64x16_c;
  dc_pred_high[1][0][0] = aom_highbd_dc_left_predictor_4x4_sse2;
  dc_pred_high[1][0][1] = aom_highbd_dc_left_predictor_8x8_sse2;
  dc_pred_high[1][0][2] = aom_highbd_dc_left_predictor_16x16_sse2;
  dc_pred_high[1][0][3] = aom_highbd_dc_left_predictor_32x32_sse2;
  dc_pred_high[1][0][4] = aom_highbd_dc_left_predictor_64x64_c;
  dc_pred_high[1][0][5] = aom_highbd_dc_left_predictor_4x8_sse2;
  dc_pred_high[1][0][6] = aom_highbd_dc_left_predictor_8x4_sse2;
  dc_pred_high[1][0][7] = aom_highbd_dc_left_predictor_8x16_sse2;
  dc_pred_high[1][0][8] = aom_highbd_dc_left_predictor_16x8_sse2;
  dc_pred_high[1][0][9] = aom_highbd_dc_left_predictor_16x32_sse2;
  dc_pred_high[1][0][10] = aom_highbd_dc_left_predictor_32x16_sse2;
  dc_pred_high[1][0][0xb] = aom_highbd_dc_left_predictor_32x64_c;
  dc_pred_high[1][0][0xc] = aom_highbd_dc_left_predictor_64x32_c;
  dc_pred_high[1][0][0xd] = aom_highbd_dc_left_predictor_4x16_c;
  dc_pred_high[1][0][0xe] = aom_highbd_dc_left_predictor_16x4_c;
  dc_pred_high[1][0][0xf] = aom_highbd_dc_left_predictor_8x32_c;
  dc_pred_high[1][0][0x10] = aom_highbd_dc_left_predictor_32x8_c;
  dc_pred_high[1][0][0x11] = aom_highbd_dc_left_predictor_16x64_c;
  dc_pred_high[1][0][0x12] = aom_highbd_dc_left_predictor_64x16_c;
  dc_pred_high[1][1][0] = aom_highbd_dc_predictor_4x4_sse2;
  dc_pred_high[1][1][1] = aom_highbd_dc_predictor_8x8_sse2;
  dc_pred_high[1][1][2] = aom_highbd_dc_predictor_16x16_sse2;
  dc_pred_high[1][1][3] = aom_highbd_dc_predictor_32x32_sse2;
  dc_pred_high[1][1][4] = aom_highbd_dc_predictor_64x64_c;
  dc_pred_high[1][1][5] = aom_highbd_dc_predictor_4x8_sse2;
  dc_pred_high[1][1][6] = aom_highbd_dc_predictor_8x4_sse2;
  dc_pred_high[1][1][7] = aom_highbd_dc_predictor_8x16_sse2;
  dc_pred_high[1][1][8] = aom_highbd_dc_predictor_16x8_sse2;
  dc_pred_high[1][1][9] = aom_highbd_dc_predictor_16x32_sse2;
  dc_pred_high[1][1][10] = aom_highbd_dc_predictor_32x16_sse2;
  dc_pred_high[1][1][0xb] = aom_highbd_dc_predictor_32x64_c;
  dc_pred_high[1][1][0xc] = aom_highbd_dc_predictor_64x32_c;
  dc_pred_high[1][1][0xd] = aom_highbd_dc_predictor_4x16_c;
  dc_pred_high[1][1][0xe] = aom_highbd_dc_predictor_16x4_c;
  dc_pred_high[1][1][0xf] = aom_highbd_dc_predictor_8x32_c;
  dc_pred_high[1][1][0x10] = aom_highbd_dc_predictor_32x8_c;
  dc_pred_high[1][1][0x11] = aom_highbd_dc_predictor_16x64_c;
  dc_pred_high[1][1][0x12] = aom_highbd_dc_predictor_64x16_c;
  return;
}

Assistant:

static void init_intra_predictors_internal(void) {
  assert(NELEMENTS(mode_to_angle_map) == INTRA_MODES);

#if CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
#define INIT_RECTANGULAR(p, type)             \
  p[TX_4X8] = aom_##type##_predictor_4x8;     \
  p[TX_8X4] = aom_##type##_predictor_8x4;     \
  p[TX_8X16] = aom_##type##_predictor_8x16;   \
  p[TX_16X8] = aom_##type##_predictor_16x8;   \
  p[TX_16X32] = aom_##type##_predictor_16x32; \
  p[TX_32X16] = aom_##type##_predictor_32x16; \
  p[TX_32X64] = aom_##type##_predictor_32x64; \
  p[TX_64X32] = aom_##type##_predictor_64x32;
#else
#define INIT_RECTANGULAR(p, type)             \
  p[TX_4X8] = aom_##type##_predictor_4x8;     \
  p[TX_8X4] = aom_##type##_predictor_8x4;     \
  p[TX_8X16] = aom_##type##_predictor_8x16;   \
  p[TX_16X8] = aom_##type##_predictor_16x8;   \
  p[TX_16X32] = aom_##type##_predictor_16x32; \
  p[TX_32X16] = aom_##type##_predictor_32x16; \
  p[TX_32X64] = aom_##type##_predictor_32x64; \
  p[TX_64X32] = aom_##type##_predictor_64x32; \
  p[TX_4X16] = aom_##type##_predictor_4x16;   \
  p[TX_16X4] = aom_##type##_predictor_16x4;   \
  p[TX_8X32] = aom_##type##_predictor_8x32;   \
  p[TX_32X8] = aom_##type##_predictor_32x8;   \
  p[TX_16X64] = aom_##type##_predictor_16x64; \
  p[TX_64X16] = aom_##type##_predictor_64x16;
#endif  // CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER

#define INIT_NO_4X4(p, type)                  \
  p[TX_8X8] = aom_##type##_predictor_8x8;     \
  p[TX_16X16] = aom_##type##_predictor_16x16; \
  p[TX_32X32] = aom_##type##_predictor_32x32; \
  p[TX_64X64] = aom_##type##_predictor_64x64; \
  INIT_RECTANGULAR(p, type)

#define INIT_ALL_SIZES(p, type)           \
  p[TX_4X4] = aom_##type##_predictor_4x4; \
  INIT_NO_4X4(p, type)

  INIT_ALL_SIZES(pred[V_PRED], v)
  INIT_ALL_SIZES(pred[H_PRED], h)
  INIT_ALL_SIZES(pred[PAETH_PRED], paeth)
  INIT_ALL_SIZES(pred[SMOOTH_PRED], smooth)
  INIT_ALL_SIZES(pred[SMOOTH_V_PRED], smooth_v)
  INIT_ALL_SIZES(pred[SMOOTH_H_PRED], smooth_h)
  INIT_ALL_SIZES(dc_pred[0][0], dc_128)
  INIT_ALL_SIZES(dc_pred[0][1], dc_top)
  INIT_ALL_SIZES(dc_pred[1][0], dc_left)
  INIT_ALL_SIZES(dc_pred[1][1], dc)
#if CONFIG_AV1_HIGHBITDEPTH
  INIT_ALL_SIZES(pred_high[V_PRED], highbd_v)
  INIT_ALL_SIZES(pred_high[H_PRED], highbd_h)
  INIT_ALL_SIZES(pred_high[PAETH_PRED], highbd_paeth)
  INIT_ALL_SIZES(pred_high[SMOOTH_PRED], highbd_smooth)
  INIT_ALL_SIZES(pred_high[SMOOTH_V_PRED], highbd_smooth_v)
  INIT_ALL_SIZES(pred_high[SMOOTH_H_PRED], highbd_smooth_h)
  INIT_ALL_SIZES(dc_pred_high[0][0], highbd_dc_128)
  INIT_ALL_SIZES(dc_pred_high[0][1], highbd_dc_top)
  INIT_ALL_SIZES(dc_pred_high[1][0], highbd_dc_left)
  INIT_ALL_SIZES(dc_pred_high[1][1], highbd_dc)
#endif
#undef intra_pred_allsizes
}